

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O1

void __thiscall Messages::AddressBook::MergeFrom(AddressBook *this,AddressBook *from)

{
  LogMessage *pLVar1;
  LogFinisher local_51;
  LogMessage local_50 [56];
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SamuelXing[P]protobuf-over-tcpsocket-example/build_O1/proto/messages.pb.cc"
               ,0x3ce);
    pLVar1 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(local_50);
  }
  if ((*(ulong *)&from->field_0x8 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)&this->field_0x8,
               (UnknownFieldSet *)((*(ulong *)&from->field_0x8 & 0xfffffffffffffffe) + 8));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<Messages::Person>::TypeHandler>
            (&(this->people_).super_RepeatedPtrFieldBase,&(from->people_).super_RepeatedPtrFieldBase
            );
  return;
}

Assistant:

void AddressBook::MergeFrom(const AddressBook& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:Messages.AddressBook)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  people_.MergeFrom(from.people_);
}